

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chset.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
set_class(compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          *this,char_class_type *m,bool no)

{
  iterator __position;
  undefined7 in_register_00000011;
  
  this->has_posix_ = true;
  if ((int)CONCAT71(in_register_00000011,no) == 0) {
    this->posix_yes_ = this->posix_yes_ | *m;
    return;
  }
  __position._M_current =
       (this->posix_no_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (this->posix_no_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    *__position._M_current = *m;
    (this->posix_no_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
    return;
  }
  std::vector<unsigned_short,std::allocator<unsigned_short>>::
  _M_realloc_insert<unsigned_short_const&>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->posix_no_,__position,m)
  ;
  return;
}

Assistant:

void set_class(char_class_type const &m, bool no)
    {
        this->has_posix_ = true;

        if(no)
        {
            this->posix_no_.push_back(m);
        }
        else
        {
            this->posix_yes_ |= m;
        }
    }